

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_check_palette_indexes(png_structrp png_ptr,png_row_infop row_info)

{
  uint uVar1;
  sbyte sVar2;
  int i_1;
  int i;
  png_bytep rp;
  int padding;
  png_row_infop row_info_local;
  png_structrp png_ptr_local;
  
  if (((int)(uint)png_ptr->num_palette < 1 << (row_info->bit_depth & 0x1f)) &&
     (png_ptr->num_palette != 0)) {
    rp._4_4_ = 8 - (uint)row_info->pixel_depth * row_info->width & 7;
    _i_1 = png_ptr->row_buf + row_info->rowbytes;
    switch(row_info->bit_depth) {
    case '\x01':
      for (; png_ptr->row_buf < _i_1; _i_1 = _i_1 + -1) {
        if ((int)(uint)*_i_1 >> (sbyte)rp._4_4_ != 0) {
          png_ptr->num_palette_max = 1;
        }
        rp._4_4_ = 0;
      }
      break;
    case '\x02':
      for (; png_ptr->row_buf < _i_1; _i_1 = _i_1 + -1) {
        sVar2 = (sbyte)rp._4_4_;
        uVar1 = (int)(uint)*_i_1 >> sVar2 & 3;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        uVar1 = ((int)(uint)*_i_1 >> sVar2) >> 2 & 3;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        uVar1 = ((int)(uint)*_i_1 >> sVar2) >> 4 & 3;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        uVar1 = ((int)(uint)*_i_1 >> sVar2) >> 6 & 3;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        rp._4_4_ = 0;
      }
      break;
    default:
      break;
    case '\x04':
      for (; png_ptr->row_buf < _i_1; _i_1 = _i_1 + -1) {
        uVar1 = (int)(uint)*_i_1 >> (sbyte)rp._4_4_ & 0xf;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        uVar1 = ((int)(uint)*_i_1 >> (sbyte)rp._4_4_) >> 4 & 0xf;
        if (png_ptr->num_palette_max < (int)uVar1) {
          png_ptr->num_palette_max = uVar1;
        }
        rp._4_4_ = 0;
      }
      break;
    case '\b':
      for (; png_ptr->row_buf < _i_1; _i_1 = _i_1 + -1) {
        if (png_ptr->num_palette_max < (int)(uint)*_i_1) {
          png_ptr->num_palette_max = (uint)*_i_1;
        }
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_check_palette_indexes(png_structrp png_ptr, png_row_infop row_info)
{
   if (png_ptr->num_palette < (1 << row_info->bit_depth) &&
      png_ptr->num_palette > 0) /* num_palette can be 0 in MNG files */
   {
      /* Calculations moved outside switch in an attempt to stop different
       * compiler warnings.  'padding' is in *bits* within the last byte, it is
       * an 'int' because pixel_depth becomes an 'int' in the expression below,
       * and this calculation is used because it avoids warnings that other
       * forms produced on either GCC or MSVC.
       */
      int padding = PNG_PADBITS(row_info->pixel_depth, row_info->width);
      png_bytep rp = png_ptr->row_buf + row_info->rowbytes;

      switch (row_info->bit_depth)
      {
         case 1:
         {
            /* in this case, all bytes must be 0 so we don't need
             * to unpack the pixels except for the rightmost one.
             */
            for (; rp > png_ptr->row_buf; rp--)
            {
              if ((*rp >> padding) != 0)
                 png_ptr->num_palette_max = 1;
              padding = 0;
            }

            break;
         }

         case 2:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 2) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 6) & 0x03);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 4:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
              int i = ((*rp >> padding) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              i = (((*rp >> padding) >> 4) & 0x0f);

              if (i > png_ptr->num_palette_max)
                 png_ptr->num_palette_max = i;

              padding = 0;
            }

            break;
         }

         case 8:
         {
            for (; rp > png_ptr->row_buf; rp--)
            {
               if (*rp > png_ptr->num_palette_max)
                  png_ptr->num_palette_max = (int) *rp;
            }

            break;
         }

         default:
            break;
      }
   }
}